

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

shared_ptr<mocker::ast::VarDeclStmt> __thiscall
mocker::Parser::varDeclStmt(Parser *this,TokIter *iter,TokIter end)

{
  undefined8 uVar1;
  TokIter iter_00;
  Token *pTVar2;
  TokIter TVar3;
  TokenID TVar4;
  undefined8 extraout_RAX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  shared_ptr<mocker::ast::VarDeclStmt> sVar6;
  Position beg;
  Position beg_00;
  Position end_00;
  Position end_01;
  GetTokenID id;
  shared_ptr<mocker::ast::Type> varType;
  shared_ptr<mocker::ast::Expression> expr;
  Parser local_78;
  shared_ptr<mocker::ast::Type> *local_60;
  shared_ptr<mocker::ast::Identifier> ident;
  anon_class_24_2_341b408a local_48;
  
  Token::position(*end._M_current);
  TVar3._M_current = local_78.tokBeg._M_current;
  local_48.begPos.line = (size_t)local_78.tokBeg._M_current;
  local_48.begPos.col = (size_t)local_78.tokEnd._M_current;
  uVar1 = *(undefined8 *)end._M_current;
  local_48.iter = (TokIter *)end._M_current;
  type(&local_78,iter,end);
  if (local_78.tokBeg._M_current == (Token *)0x0) {
LAB_00171b26:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78.tokEnd);
    _Var5._M_pi = extraout_RDX_00;
  }
  else {
    identifier((Parser *)&varType,iter,end);
    if (varType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&varType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      goto LAB_00171b26;
    }
    iter_00._M_current = *end._M_current;
    *(Token **)end._M_current = iter_00._M_current + 1;
    TVar4 = GetTokenID::operator()(&id,iter_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&varType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78.tokEnd);
    _Var5._M_pi = extraout_RDX;
    if (TVar4 != LeftParen) {
      *(undefined8 *)end._M_current = uVar1;
      type((Parser *)&varType,iter,end);
      if (varType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        __assert_fail("varType",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/parse/parser.cpp"
                      ,0x1bd,
                      "std::shared_ptr<ast::VarDeclStmt> mocker::Parser::varDeclStmt(TokIter &, TokIter)"
                     );
      }
      identifier((Parser *)&ident,iter,end);
      if (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        __assert_fail("ident",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/parse/parser.cpp"
                      ,0x1bf,
                      "std::shared_ptr<ast::VarDeclStmt> mocker::Parser::varDeclStmt(TokIter &, TokIter)"
                     );
      }
      TVar4 = GetTokenID::operator()(&id,*end._M_current);
      if (TVar4 != Semicolon) {
        TVar4 = GetTokenID::operator()(&id,*end._M_current);
        if (TVar4 != Assign) goto LAB_00171c5d;
        *(long *)end._M_current = *(long *)end._M_current + 0x38;
        assignmentExpr((Parser *)&expr,iter,end);
        if (expr.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          TVar4 = GetTokenID::operator()(&id,*end._M_current);
          if (TVar4 == Semicolon) {
            pTVar2 = *end._M_current;
            *(Token **)end._M_current = pTVar2 + 1;
            Token::position(pTVar2);
            beg_00.col = (size_t)TVar3._M_current;
            beg_00.line = (size_t)iter;
            end_01.col = (size_t)local_78.pos;
            end_01.line = (size_t)local_78.tokEnd._M_current;
            makeNode<mocker::ast::VarDeclStmt,std::shared_ptr<mocker::ast::Type>&,std::shared_ptr<mocker::ast::Identifier>&,std::shared_ptr<mocker::ast::Expression>&>
                      (this,beg_00,end_01,local_60,(shared_ptr<mocker::ast::Identifier> *)&varType,
                       (shared_ptr<mocker::ast::Expression> *)&ident);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&expr.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            goto LAB_00171bfc;
          }
        }
        varDeclStmt::anon_class_24_2_341b408a::operator()(&local_48);
LAB_00171c5d:
        varDeclStmt::anon_class_24_2_341b408a::operator()(&local_48);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&varType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        _Unwind_Resume(extraout_RAX);
      }
      pTVar2 = *end._M_current;
      *(Token **)end._M_current = pTVar2 + 1;
      Token::position(pTVar2);
      expr.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      beg.col = (size_t)TVar3._M_current;
      beg.line = (size_t)iter;
      end_00.col = (size_t)local_78.pos;
      end_00.line = (size_t)local_78.tokEnd._M_current;
      makeNode<mocker::ast::VarDeclStmt,std::shared_ptr<mocker::ast::Type>&,std::shared_ptr<mocker::ast::Identifier>&,decltype(nullptr)>
                (this,beg,end_00,local_60,(shared_ptr<mocker::ast::Identifier> *)&varType,
                 (void **)&ident);
LAB_00171bfc:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&varType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      _Var5._M_pi = extraout_RDX_01;
      goto LAB_00171b3f;
    }
  }
  *(undefined8 *)end._M_current = uVar1;
  (this->tokBeg)._M_current = (Token *)0x0;
  (this->tokEnd)._M_current = (Token *)0x0;
LAB_00171b3f:
  sVar6.super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar6.super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::VarDeclStmt>)
         sVar6.super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::VarDeclStmt> Parser::varDeclStmt(TokIter &iter,
                                                      TokIter end) {
  auto id = GetTokenID(end);
  auto begPos = iter->position().first;
  auto throwError = [begPos, &iter] {
    throw SyntaxError(begPos, iter->position().second);
  };

  // look ahead
  auto beg = iter;
  if (!type(iter, end) || !identifier(iter, end) ||
      id(iter++) == TokenID::LeftParen) {
    iter = beg;
    return nullptr;
  }
  iter = beg;

  auto varType = type(iter, end);
  assert(varType);
  auto ident = identifier(iter, end);
  assert(ident);
  if (id(iter) == TokenID::Semicolon)
    return makeNode<ast::VarDeclStmt>(begPos, (iter++)->position().second,
                                      varType, ident, nullptr);

  if (id(iter) != TokenID::Assign)
    throwError();
  ++iter;
  auto expr = expression(iter, end);
  if (!expr)
    throwError();
  if (id(iter) != TokenID::Semicolon)
    throwError();
  return makeNode<ast::VarDeclStmt>(begPos, (iter++)->position().second,
                                    varType, ident, expr);
}